

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsMacOSMachOLinker.cxx
# Opt level: O0

bool __thiscall
cmBinUtilsMacOSMachOLinker::ResolveRPathDependency
          (cmBinUtilsMacOSMachOLinker *this,string *name,string *executablePath,string *loaderPath,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *rpaths,string *path,bool *resolved)

{
  bool bVar1;
  undefined1 local_80 [8];
  string searchFile;
  string *rpath;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string *path_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *rpaths_local;
  string *loaderPath_local;
  string *executablePath_local;
  string *name_local;
  cmBinUtilsMacOSMachOLinker *this_local;
  
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(rpaths);
  rpath = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(rpaths);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&rpath), bVar1) {
    searchFile.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&__end1);
    std::__cxx11::string::string((string *)local_80,(string *)name);
    std::__cxx11::string::replace((ulong)local_80,0,(string *)0x6);
    bVar1 = cmHasLiteralPrefix<std::__cxx11::string,14ul>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80
                       ,(char (*) [14])"@loader_path/");
    if (bVar1) {
      bVar1 = ResolveLoaderPathDependency(this,(string *)local_80,loaderPath,path,resolved);
      if (bVar1) {
        if ((*resolved & 1U) == 0) goto LAB_005474c4;
        this_local._7_1_ = 1;
        bVar1 = true;
      }
      else {
        this_local._7_1_ = 0;
        bVar1 = true;
      }
    }
    else {
      bVar1 = cmHasLiteralPrefix<std::__cxx11::string,18ul>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_80,(char (*) [18])"@executable_path/");
      if (bVar1) {
        bVar1 = ResolveExecutablePathDependency
                          (this,(string *)local_80,executablePath,path,resolved);
        if (bVar1) {
          if ((*resolved & 1U) == 0) goto LAB_005474c4;
          this_local._7_1_ = 1;
          bVar1 = true;
        }
        else {
          this_local._7_1_ = 0;
          bVar1 = true;
        }
      }
      else {
        bVar1 = cmsys::SystemTools::PathExists((string *)local_80);
        if (bVar1) {
          std::__cxx11::string::operator=((string *)path,(string *)local_80);
          *resolved = true;
          this_local._7_1_ = 1;
          bVar1 = true;
        }
        else {
LAB_005474c4:
          bVar1 = false;
        }
      }
    }
    std::__cxx11::string::~string((string *)local_80);
    if (bVar1) goto LAB_00547500;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  *resolved = false;
  this_local._7_1_ = 1;
LAB_00547500:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmBinUtilsMacOSMachOLinker::ResolveRPathDependency(
  std::string const& name, std::string const& executablePath,
  std::string const& loaderPath, std::vector<std::string> const& rpaths,
  std::string& path, bool& resolved)
{
  for (std::string const& rpath : rpaths) {
    std::string searchFile = name;
    searchFile.replace(0, 6, rpath);
    if (cmHasLiteralPrefix(searchFile, "@loader_path/")) {
      if (!this->ResolveLoaderPathDependency(searchFile, loaderPath, path,
                                             resolved)) {
        return false;
      }
      if (resolved) {
        return true;
      }
    } else if (cmHasLiteralPrefix(searchFile, "@executable_path/")) {
      if (!this->ResolveExecutablePathDependency(searchFile, executablePath,
                                                 path, resolved)) {
        return false;
      }
      if (resolved) {
        return true;
      }
    } else if (cmSystemTools::PathExists(searchFile)) {
      /*
       * paraphrasing @ben.boeckel:
       *  if /b/libB.dylib is supposed to be used,
       *  /a/libbB.dylib will be found first if it exists. CMake tries to
       *  sort rpath directories to avoid this, but sometimes there is no
       *  right answer.
       *
       *  I believe it is possible to resolve this using otools -l
       *  then checking the LC_LOAD_DYLIB command whose name is
       *  equal to the value of search_file, UNLESS the build
       *  specifically sets the RPath to paths that will match
       *  duplicate libs; at this point can we just point to
       *  user error, or is there a reason why the advantages
       *  to this scenario outweigh its disadvantages?
       *
       *  Also priority seems to be the order as passed in when compiled
       *  so as long as this method's resolution guarantees priority
       *  in that manner further checking should not be necessary?
       */
      path = searchFile;
      resolved = true;
      return true;
    }
  }

  resolved = false;
  return true;
}